

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall
leveldb::log::LogTest_ReadWrite_Test::LogTest_ReadWrite_Test(LogTest_ReadWrite_Test *this)

{
  LogTest_ReadWrite_Test *this_local;
  
  LogTest::LogTest(&this->super_LogTest);
  (this->super_LogTest).super_Test._vptr_Test = (_func_int **)&PTR__LogTest_ReadWrite_Test_00192d10;
  return;
}

Assistant:

TEST_F(LogTest, ReadWrite) {
  Write("foo");
  Write("bar");
  Write("");
  Write("xxxx");
  ASSERT_EQ("foo", Read());
  ASSERT_EQ("bar", Read());
  ASSERT_EQ("", Read());
  ASSERT_EQ("xxxx", Read());
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ("EOF", Read());  // Make sure reads at eof work
}